

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O0

void WebRtcIsac_InitTransform(TransformTables *tables)

{
  double dVar1;
  double local_28;
  double phase;
  double fact;
  int k;
  TransformTables *tables_local;
  
  local_28 = 0.0;
  for (fact._4_4_ = 0; fact._4_4_ < 0xf0; fact._4_4_ = fact._4_4_ + 1) {
    dVar1 = cos(local_28);
    tables->costab1[fact._4_4_] = dVar1;
    dVar1 = sin(local_28);
    tables->sintab1[fact._4_4_] = dVar1;
    local_28 = local_28 + 0.013089969389957459;
  }
  local_28 = 1.5642513420999162;
  for (fact._4_4_ = 0; fact._4_4_ < 0x78; fact._4_4_ = fact._4_4_ + 1) {
    dVar1 = cos(local_28);
    tables->costab2[fact._4_4_] = dVar1;
    dVar1 = sin(local_28);
    tables->sintab2[fact._4_4_] = dVar1;
    local_28 = local_28 + 3.1285026841998325;
  }
  return;
}

Assistant:

void WebRtcIsac_InitTransform(TransformTables* tables) {
  int k;
  double fact, phase;

  fact = PI / (FRAMESAMPLES_HALF);
  phase = 0.0;
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tables->costab1[k] = cos(phase);
    tables->sintab1[k] = sin(phase);
    phase += fact;
  }

  fact = PI * ((double) (FRAMESAMPLES_HALF - 1)) / ((double) FRAMESAMPLES_HALF);
  phase = 0.5 * fact;
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    tables->costab2[k] = cos(phase);
    tables->sintab2[k] = sin(phase);
    phase += fact;
  }
}